

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutFlowBC.cpp
# Opt level: O2

bool OutFlowBC::HasOutFlowBC(BCRec *_phys_bc)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = false;
  for (lVar2 = -0xc; lVar2 != 0; lVar2 = lVar2 + 4) {
    bVar1 = (bool)(bVar1 | (*(int *)((long)_phys_bc[1].bc + lVar2) == 2 ||
                           *(int *)((long)_phys_bc->bc + lVar2 + 0xc) == 2));
  }
  return bVar1;
}

Assistant:

bool
OutFlowBC::HasOutFlowBC (BCRec* _phys_bc)
{
    bool has_out_flow = false;
    int  numOutFlowBC = 0;

    for (int idir = 0; idir < BL_SPACEDIM; idir++)
    {
        if (_phys_bc->lo(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }

        if (_phys_bc->hi(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }
    }

    return has_out_flow;
}